

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall dpfb::Image::Image(Image *this,int w,int h)

{
  runtime_error *this_00;
  
  this->w = w;
  this->h = h;
  this->pitch = w;
  (this->ownData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ownData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ownData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (w < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Width is < 0");
  }
  else {
    if (-1 < h) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->ownData,(ulong)(uint)h * (ulong)(uint)w);
      this->data = (this->ownData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Height is < 0");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Image::Image(int w, int h)
    : w {w}
    , h {h}
    , pitch {w}
{
    if (w < 0)
        throw std::runtime_error("Width is < 0");
    if (h < 0)
        throw std::runtime_error("Height is < 0");

    ownData.resize(static_cast<std::size_t>(w) * h);
    data = ownData.data();

}